

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_push(DisasContext_conflict2 *s,TCGv_i32 val)

{
  TCGContext_conflict2 *s_00;
  TCGTemp *a2;
  TCGv_i32 *ppTVar1;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 ret;
  
  s_00 = s->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a2 - (long)s_00);
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  tcg_gen_subi_i32_m68k(s_00,ret,ppTVar1[7],4);
  tcg_gen_qemu_st_i32_m68k
            (s->uc->tcg_ctx,val,ret,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),MO_BEUL);
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  if (ppTVar1[7] != ret) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(ppTVar1[7] + (long)s_00),(TCGArg)a2);
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void gen_push(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, val, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, QREG_SP, tmp);
    tcg_temp_free(tcg_ctx, tmp);
}